

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

opj_tcd_t * tcd_create(opj_common_ptr cinfo)

{
  opj_tcd_image_t *poVar1;
  opj_common_ptr in_RDI;
  opj_tcd_t *tcd;
  opj_tcd_t *local_8;
  
  local_8 = (opj_tcd_t *)malloc(0x58);
  if (local_8 == (opj_tcd_t *)0x0) {
    local_8 = (opj_tcd_t *)0x0;
  }
  else {
    local_8->cinfo = in_RDI;
    poVar1 = (opj_tcd_image_t *)malloc(0x10);
    local_8->tcd_image = poVar1;
    if (local_8->tcd_image == (opj_tcd_image_t *)0x0) {
      free(local_8);
      local_8 = (opj_tcd_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

opj_tcd_t* tcd_create(opj_common_ptr cinfo) {
	/* create the tcd structure */
	opj_tcd_t *tcd = (opj_tcd_t*)opj_malloc(sizeof(opj_tcd_t));
	if(!tcd) return NULL;
	tcd->cinfo = cinfo;
	tcd->tcd_image = (opj_tcd_image_t*)opj_malloc(sizeof(opj_tcd_image_t));
	if(!tcd->tcd_image) {
		opj_free(tcd);
		return NULL;
	}

	return tcd;
}